

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Sphere *sphere)

{
  Point *pPVar1;
  float fVar2;
  Point PVar3;
  Vector VVar4;
  undefined8 local_178;
  float local_170;
  Point local_148 [4];
  Point local_118;
  float local_10c;
  float fStack_108;
  float dot;
  float local_100;
  Point local_f8;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  Vector local_c8;
  undefined1 local_b8 [8];
  Vector ri;
  float fStack_a4;
  float local_a0;
  Vector local_98 [8];
  Vector local_38;
  undefined1 local_28 [8];
  Point normalVector;
  Sphere *sphere_local;
  Segment *segment_local;
  
  unique0x100002ad = sphere;
  PVar3 = operator-(segment->b,&sphere->center);
  PVar3 = operator/(PVar3,stack0xffffffffffffffe8->radius);
  local_98[0].z = PVar3.z;
  local_38.z = local_98[0].z;
  local_98[0]._0_8_ = PVar3._0_8_;
  local_38.x = local_98[0].x;
  local_38.y = local_98[0].y;
  VVar4 = normalize(&local_38);
  local_a0 = VVar4.z;
  normalVector.x = local_a0;
  stack0xffffffffffffff58 = VVar4._0_8_;
  local_28._0_4_ = ri.z;
  local_28._4_4_ = fStack_a4;
  local_e0 = (segment->b).z;
  pPVar1 = &segment->b;
  local_e8._0_4_ = pPVar1->x;
  local_e8._4_4_ = pPVar1->y;
  local_d8 = local_e8;
  local_d0 = local_e0;
  unique0x100002a1 = VVar4;
  PVar3 = operator-(*pPVar1,&segment->a);
  local_f8.z = PVar3.z;
  local_c8.z = local_f8.z;
  local_f8._0_8_ = PVar3._0_8_;
  local_c8.x = local_f8.x;
  local_c8.y = local_f8.y;
  local_f8 = PVar3;
  VVar4 = normalize(&local_c8);
  local_100 = VVar4.z;
  ri.x = local_100;
  _fStack_108 = VVar4._0_8_;
  local_b8._0_4_ = fStack_108;
  local_b8._4_4_ = dot;
  _fStack_108 = VVar4;
  local_10c = dotProduct((Vector *)local_b8,(Vector *)local_28);
  PVar3.z = normalVector.x;
  PVar3.x = (float)local_28._0_4_;
  PVar3.y = (float)local_28._4_4_;
  PVar3 = operator*(PVar3,local_10c + local_10c);
  local_148[0].z = PVar3.z;
  local_118.z = local_148[0].z;
  local_148[0]._0_8_ = PVar3._0_8_;
  local_118.x = local_148[0].x;
  local_118.y = local_148[0].y;
  operator-=((Vector *)local_b8,&local_118);
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar2 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar2;
  PVar3 = operator+(segment->b,(Vector *)local_b8);
  local_178 = PVar3._0_8_;
  (__return_storage_ptr__->b).x = (float)(undefined4)local_178;
  (__return_storage_ptr__->b).y = (float)local_178._4_4_;
  local_170 = PVar3.z;
  (__return_storage_ptr__->b).z = local_170;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Sphere const& sphere)
{
  Point normalVector = normalize((segment.b - sphere.center) / sphere.radius);

  Vector ri = normalize(segment.b - segment.a);
  float dot = dotProduct(ri, normalVector);
  ri -= normalVector * (2 * dot);

  return {segment.b, segment.b + ri};
}